

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_strifeweapons.cpp
# Opt level: O0

AInventory * __thiscall ASigil::CreateCopy(ASigil *this,AActor *other)

{
  ASigil *pAVar1;
  ASigil *copy;
  AActor *other_local;
  ASigil *this_local;
  
  pAVar1 = Spawn<ASigil>();
  (pAVar1->super_AWeapon).super_AInventory.Amount = (this->super_AWeapon).super_AInventory.Amount;
  (pAVar1->super_AWeapon).super_AInventory.MaxAmount =
       (this->super_AWeapon).super_AInventory.MaxAmount;
  *(undefined4 *)&(pAVar1->super_AWeapon).field_0x584 =
       *(undefined4 *)&(this->super_AWeapon).field_0x584;
  (pAVar1->super_AWeapon).super_AInventory.Icon.texnum =
       (this->super_AWeapon).super_AInventory.Icon.texnum;
  (*(this->super_AWeapon).super_AInventory.super_AActor.super_DThinker.super_DObject._vptr_DObject
    [0x36])();
  return (AInventory *)pAVar1;
}

Assistant:

AInventory *ASigil::CreateCopy (AActor *other)
{
	ASigil *copy = Spawn<ASigil> ();
	copy->Amount = Amount;
	copy->MaxAmount = MaxAmount;
	copy->NumPieces = NumPieces;
	copy->Icon = Icon;
	GoAwayAndDie ();
	return copy;
}